

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bdestroy(bstring b)

{
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->slen < 0)) || (b->mlen < 1)) ||
     ((b->mlen < b->slen || (b->data == (uchar *)0x0)))) {
    b_local._4_4_ = -1;
  }
  else {
    free(b->data);
    b->slen = -1;
    b->mlen = -0x392;
    b->data = (uchar *)0x0;
    free(b);
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int bdestroy (bstring b) {
	if (b == NULL || b->slen < 0 || b->mlen <= 0 || b->mlen < b->slen ||
	    b->data == NULL)
		return BSTR_ERR;

	bstr__free (b->data);

	/* In case there is any stale usage, there is one more chance to 
	   notice this error. */

	b->slen = -1;
	b->mlen = -__LINE__;
	b->data = NULL;

	bstr__free (b);
	return 0;
}